

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::find_library_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_program *program)

{
  ulong uVar1;
  string *psVar2;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  string local_130;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  t_program *local_20;
  t_program *program_local;
  t_dart_generator *this_local;
  string *name;
  
  local_21 = 0;
  local_20 = program;
  program_local = (t_program *)this;
  this_local = (t_dart_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"dart",&local_49);
  t_program::get_namespace(__return_storage_ptr__,program,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    psVar2 = t_program::get_name_abi_cxx11_(local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar2);
  }
  std::__cxx11::string::string((string *)&local_a0,(string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,".",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"_",&local_e9);
  replace_all(&local_80,this,&local_a0,&local_c0,&local_e8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_130,(string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"-",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"_",&local_179);
  replace_all(&local_110,this,&local_130,&local_150,&local_178);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::find_library_name(t_program* program) {
  string name = program->get_namespace("dart");
  if (name.empty()) {
    name = program->get_name();
  }
  name = replace_all(name, ".", "_");
  name = replace_all(name, "-", "_");
  return name;
}